

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void nlohmann::detail::int_to_string<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target,
               size_t value)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (value < 10) {
    uVar4 = 1;
  }
  else {
    sVar3 = value;
    uVar2 = 4;
    do {
      uVar4 = uVar2;
      if (sVar3 < 100) {
        uVar4 = uVar4 - 2;
        goto LAB_00108ce2;
      }
      if (sVar3 < 1000) {
        uVar4 = uVar4 - 1;
        goto LAB_00108ce2;
      }
      if (sVar3 < 10000) goto LAB_00108ce2;
      bVar1 = 99999 < sVar3;
      sVar3 = sVar3 / 10000;
      uVar2 = uVar4 + 4;
    } while (bVar1);
    uVar4 = uVar4 + 1;
  }
LAB_00108ce2:
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_40,(ulong)uVar4,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_40._M_dataplus._M_p,(uint)local_40._M_string_length,value);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (target,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void int_to_string( string_type& target, std::size_t value )
{
    // For ADL
    using std::to_string;
    target = to_string(value);
}